

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_bary3d(REF_NODE ref_node,REF_INT *nodes,REF_DBL *xyz,REF_DBL *bary)

{
  REF_DBL *xyz0_00;
  REF_DBL *xyz1_00;
  REF_DBL *xyz2_00;
  double local_108;
  double local_f8;
  double local_f0;
  double local_e0;
  double local_d8;
  double local_c8;
  int local_c0;
  REF_INT i;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL xyzp [3];
  double local_88;
  REF_DBL total_normal [3];
  double local_68;
  REF_DBL normal [3];
  REF_DBL total;
  REF_DBL *xyz2;
  REF_DBL *xyz1;
  REF_DBL *xyz0;
  REF_DBL *bary_local;
  REF_DBL *xyz_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  if ((((((*nodes < 0) || (ref_node->max <= *nodes)) || (ref_node->global[*nodes] < 0)) ||
       ((nodes[1] < 0 || (ref_node->max <= nodes[1])))) ||
      ((ref_node->global[nodes[1]] < 0 || ((nodes[2] < 0 || (ref_node->max <= nodes[2])))))) ||
     (ref_node->global[nodes[2]] < 0)) {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xaf8,
           "ref_node_bary3d",3,"node invalid");
    ref_node_local._4_4_ = 3;
  }
  else {
    xyz0_00 = ref_node->real + *nodes * 0xf;
    xyz1_00 = ref_node->real + nodes[1] * 0xf;
    xyz2_00 = ref_node->real + nodes[2] * 0xf;
    ref_node_local._4_4_ = ref_node_xyz_normal(xyz0_00,xyz1_00,xyz2_00,&local_88);
    if (ref_node_local._4_4_ == 0) {
      normal[2] = (xyz[2] - xyz0_00[2]) * total_normal[1] +
                  (*xyz - *xyz0_00) * local_88 + (xyz[1] - xyz0_00[1]) * total_normal[0];
      _ref_private_macro_code_rss_1 = *xyz0_00 + -local_88 * normal[2] + (*xyz - *xyz0_00);
      xyzp[0] = xyz0_00[1] + -total_normal[0] * normal[2] + (xyz[1] - xyz0_00[1]);
      xyzp[1] = xyz0_00[2] + -total_normal[1] * normal[2] + (xyz[2] - xyz0_00[2]);
      ref_node_local._4_4_ =
           ref_node_xyz_normal((REF_DBL *)&ref_private_macro_code_rss_1,xyz1_00,xyz2_00,&local_68);
      if (ref_node_local._4_4_ == 0) {
        *bary = normal[1] * total_normal[1] + local_68 * local_88 + normal[0] * total_normal[0];
        ref_node_local._4_4_ =
             ref_node_xyz_normal(xyz0_00,(REF_DBL *)&ref_private_macro_code_rss_1,xyz2_00,&local_68)
        ;
        if (ref_node_local._4_4_ == 0) {
          bary[1] = normal[1] * total_normal[1] + local_68 * local_88 + normal[0] * total_normal[0];
          ref_node_local._4_4_ =
               ref_node_xyz_normal(xyz0_00,xyz1_00,(REF_DBL *)&ref_private_macro_code_rss_1,
                                   &local_68);
          if (ref_node_local._4_4_ == 0) {
            bary[2] = normal[1] * total_normal[1] +
                      local_68 * local_88 + normal[0] * total_normal[0];
            normal[2] = *bary + bary[1] + bary[2];
            if (normal[2] * 1e+20 <= 0.0) {
              local_c8 = -(normal[2] * 1e+20);
            }
            else {
              local_c8 = normal[2] * 1e+20;
            }
            if (*bary <= 0.0) {
              local_d8 = -*bary;
            }
            else {
              local_d8 = *bary;
            }
            if (local_d8 < local_c8) {
              if (normal[2] * 1e+20 <= 0.0) {
                local_e0 = -(normal[2] * 1e+20);
              }
              else {
                local_e0 = normal[2] * 1e+20;
              }
              if (bary[1] <= 0.0) {
                local_f0 = -bary[1];
              }
              else {
                local_f0 = bary[1];
              }
              if (local_f0 < local_e0) {
                if (normal[2] * 1e+20 <= 0.0) {
                  local_f8 = -(normal[2] * 1e+20);
                }
                else {
                  local_f8 = normal[2] * 1e+20;
                }
                if (bary[2] <= 0.0) {
                  local_108 = -bary[2];
                }
                else {
                  local_108 = bary[2];
                }
                if (local_108 < local_f8) {
                  *bary = *bary / normal[2];
                  bary[1] = bary[1] / normal[2];
                  bary[2] = bary[2] / normal[2];
                  return 0;
                }
              }
            }
            printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",normal[2],*bary,
                   bary[1],bary[2],
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0xb1e,"ref_node_bary3d");
            for (local_c0 = 0; local_c0 < 3; local_c0 = local_c0 + 1) {
              bary[local_c0] = 0.0;
            }
            ref_node_local._4_4_ = 4;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0xb10,"ref_node_bary3d",(ulong)ref_node_local._4_4_,"n2");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0xb0e,"ref_node_bary3d",(ulong)ref_node_local._4_4_,"n1");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0xb0c,"ref_node_bary3d",(ulong)ref_node_local._4_4_,"n0");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0xafe,
             "ref_node_bary3d",(ulong)ref_node_local._4_4_,"n0");
    }
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_node_bary3d(REF_NODE ref_node, REF_INT *nodes,
                                   REF_DBL *xyz, REF_DBL *bary) {
  REF_DBL *xyz0, *xyz1, *xyz2;
  REF_DBL total, normal[3], total_normal[3];
  REF_DBL xyzp[3];

  if (!ref_node_valid(ref_node, nodes[0]) ||
      !ref_node_valid(ref_node, nodes[1]) ||
      !ref_node_valid(ref_node, nodes[2]))
    RSS(REF_INVALID, "node invalid");

  xyz0 = ref_node_xyz_ptr(ref_node, nodes[0]);
  xyz1 = ref_node_xyz_ptr(ref_node, nodes[1]);
  xyz2 = ref_node_xyz_ptr(ref_node, nodes[2]);

  RSS(ref_node_xyz_normal(xyz0, xyz1, xyz2, total_normal), "n0");

  /* projects query point to triangle plane */
  xyzp[0] = xyz[0] - xyz0[0];
  xyzp[1] = xyz[1] - xyz0[1];
  xyzp[2] = xyz[2] - xyz0[2];
  total = ref_math_dot(xyzp, total_normal);
  xyzp[0] -= total_normal[0] * total;
  xyzp[1] -= total_normal[1] * total;
  xyzp[2] -= total_normal[2] * total;
  xyzp[0] += xyz0[0];
  xyzp[1] += xyz0[1];
  xyzp[2] += xyz0[2];

  RSS(ref_node_xyz_normal(xyzp, xyz1, xyz2, normal), "n0");
  bary[0] = ref_math_dot(normal, total_normal);
  RSS(ref_node_xyz_normal(xyz0, xyzp, xyz2, normal), "n1");
  bary[1] = ref_math_dot(normal, total_normal);
  RSS(ref_node_xyz_normal(xyz0, xyz1, xyzp, normal), "n2");
  bary[2] = ref_math_dot(normal, total_normal);

  total = bary[0] + bary[1] + bary[2];

  if (ref_math_divisible(bary[0], total) &&
      ref_math_divisible(bary[1], total) &&
      ref_math_divisible(bary[2], total)) {
    bary[0] /= total;
    bary[1] /= total;
    bary[2] /= total;
  } else {
    REF_INT i;
    printf("%s: %d: %s: div zero total %.18e norms %.18e %.18e %.18e\n",
           __FILE__, __LINE__, __func__, total, bary[0], bary[1], bary[2]);
    for (i = 0; i < 3; i++) bary[i] = 0.0;
    return REF_DIV_ZERO;
  }

  return REF_SUCCESS;
}